

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O3

void __thiscall embree::QuadMesh::interpolate_impl<4>(QuadMesh *this,RTCInterpolateArguments *args)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  float *pfVar4;
  float *pfVar5;
  uint *puVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  BufferView<embree::Vec3fa> *pBVar17;
  char *pcVar18;
  long lVar19;
  bool bVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  
  uVar9 = args->valueCount;
  if ((ulong)uVar9 != 0) {
    pfVar11 = args->P;
    pfVar12 = args->dPdu;
    pfVar13 = args->dPdv;
    pfVar14 = args->ddPdudu;
    pfVar15 = args->ddPdvdv;
    pfVar16 = args->ddPdudv;
    pBVar17 = (&this->vertices)[args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE].items;
    pcVar18 = pBVar17[args->bufferSlot].super_RawBufferView.ptr_ofs;
    uVar30 = (ulong)(uint)pBVar17[args->bufferSlot].super_RawBufferView.stride;
    uVar7 = args->u;
    uVar8 = args->v;
    uVar10 = args->primID;
    uVar31 = 0;
    bVar20 = (float)uVar7 + (float)uVar8 <= 1.0;
    uVar28 = 0xe;
    if (!bVar20) {
      uVar28 = 0;
    }
    uVar29 = (ulong)((bVar20 | uVar28) << 4);
    uVar28 = *(uint *)(mm_lookupmask_ps + uVar29);
    uVar21 = *(uint *)(mm_lookupmask_ps + uVar29 + 4);
    uVar22 = *(uint *)(mm_lookupmask_ps + uVar29 + 8);
    uVar23 = *(uint *)(mm_lookupmask_ps + uVar29 + 0xc);
    uVar32 = uVar28 ^ 0xffffffff;
    uVar33 = uVar21 ^ 0xffffffff;
    uVar34 = uVar22 ^ 0xffffffff;
    uVar35 = uVar23 ^ 0xffffffff;
    fVar43 = 1.0 - (float)uVar7;
    fVar36 = (float)(~uVar28 & (uint)fVar43 | uVar7 & uVar28);
    fVar37 = (float)(~uVar21 & (uint)fVar43 | uVar7 & uVar21);
    fVar38 = (float)(~uVar22 & (uint)fVar43 | uVar7 & uVar22);
    fVar43 = (float)(~uVar23 & (uint)fVar43 | uVar7 & uVar23);
    fVar39 = (float)(~uVar28 & (uint)(1.0 - (float)uVar8) | uVar28 & uVar8);
    fVar40 = (float)(~uVar21 & (uint)(1.0 - (float)uVar8) | uVar21 & uVar8);
    fVar41 = (float)(~uVar22 & (uint)(1.0 - (float)uVar8) | uVar22 & uVar8);
    fVar42 = (float)(~uVar23 & (uint)(1.0 - (float)uVar8) | uVar23 & uVar8);
    do {
      lVar19 = *(long *)&(this->super_Geometry).field_0x58;
      lVar27 = *(long *)&this->field_0x68 * (ulong)uVar10;
      uVar47 = (uint)uVar31;
      uVar44 = -(uint)((int)uVar47 < (int)uVar9);
      uVar45 = -(uint)((int)(uVar47 | 1) < (int)uVar9);
      uVar46 = -(uint)((int)(uVar47 | 2) < (int)uVar9);
      uVar47 = -(uint)((int)(uVar47 | 3) < (int)uVar9);
      puVar1 = (uint *)(pcVar18 + uVar31 * 4 + *(uint *)(lVar19 + lVar27) * uVar30);
      puVar6 = (uint *)(pcVar18 + uVar31 * 4 + *(uint *)(lVar19 + 4 + lVar27) * uVar30);
      puVar2 = (uint *)(pcVar18 + uVar31 * 4 + *(uint *)(lVar19 + 8 + lVar27) * uVar30);
      puVar3 = (uint *)(pcVar18 + uVar31 * 4 + *(uint *)(lVar19 + 0xc + lVar27) * uVar30);
      fVar48 = (float)(uVar44 & uVar32 & *puVar2 | uVar28 & uVar44 & *puVar1);
      fVar49 = (float)(uVar45 & uVar33 & puVar2[1] | uVar21 & uVar45 & puVar1[1]);
      fVar50 = (float)(uVar46 & uVar34 & puVar2[2] | uVar22 & uVar46 & puVar1[2]);
      fVar51 = (float)(uVar47 & uVar35 & puVar2[3] | uVar23 & uVar47 & puVar1[3]);
      fVar56 = (float)(*puVar3 & uVar44 & uVar32 | uVar28 & *puVar6 & uVar44);
      fVar57 = (float)(puVar3[1] & uVar45 & uVar33 | uVar21 & puVar6[1] & uVar45);
      fVar58 = (float)(puVar3[2] & uVar46 & uVar34 | uVar22 & puVar6[2] & uVar46);
      fVar59 = (float)(puVar3[3] & uVar47 & uVar35 | uVar23 & puVar6[3] & uVar47);
      fVar52 = (float)(*puVar6 & uVar44 & uVar32 | uVar28 & *puVar3 & uVar44);
      fVar53 = (float)(puVar6[1] & uVar45 & uVar33 | uVar21 & puVar3[1] & uVar45);
      fVar54 = (float)(puVar6[2] & uVar46 & uVar34 | uVar22 & puVar3[2] & uVar46);
      fVar55 = (float)(puVar6[3] & uVar47 & uVar35 | uVar23 & puVar3[3] & uVar47);
      if (pfVar11 != (float *)0x0) {
        pfVar4 = pfVar11 + uVar31;
        fVar24 = pfVar4[1];
        fVar25 = pfVar4[2];
        fVar26 = pfVar4[3];
        pfVar5 = pfVar11 + uVar31;
        *pfVar5 = (float)((uint)(((1.0 - fVar36) - fVar39) * fVar48 +
                                fVar36 * fVar56 + fVar39 * fVar52) & uVar44 |
                         ~uVar44 & (uint)*pfVar4);
        pfVar5[1] = (float)((uint)(((1.0 - fVar37) - fVar40) * fVar49 +
                                  fVar37 * fVar57 + fVar40 * fVar53) & uVar45 |
                           ~uVar45 & (uint)fVar24);
        pfVar5[2] = (float)((uint)(((1.0 - fVar38) - fVar41) * fVar50 +
                                  fVar38 * fVar58 + fVar41 * fVar54) & uVar46 |
                           ~uVar46 & (uint)fVar25);
        pfVar5[3] = (float)((uint)(((1.0 - fVar43) - fVar42) * fVar51 +
                                  fVar43 * fVar59 + fVar42 * fVar55) & uVar47 |
                           ~uVar47 & (uint)fVar26);
      }
      if (pfVar12 != (float *)0x0) {
        pfVar4 = pfVar12 + uVar31;
        fVar24 = pfVar4[1];
        fVar25 = pfVar4[2];
        fVar26 = pfVar4[3];
        pfVar5 = pfVar12 + uVar31;
        *pfVar5 = (float)(((uint)(fVar48 - fVar56) & uVar32 | (uint)(fVar56 - fVar48) & uVar28) &
                          uVar44 | ~uVar44 & (uint)*pfVar4);
        pfVar5[1] = (float)(((uint)(fVar49 - fVar57) & uVar33 | (uint)(fVar57 - fVar49) & uVar21) &
                            uVar45 | ~uVar45 & (uint)fVar24);
        pfVar5[2] = (float)(((uint)(fVar50 - fVar58) & uVar34 | (uint)(fVar58 - fVar50) & uVar22) &
                            uVar46 | ~uVar46 & (uint)fVar25);
        pfVar5[3] = (float)(((uint)(fVar51 - fVar59) & uVar35 | (uint)(fVar59 - fVar51) & uVar23) &
                            uVar47 | ~uVar47 & (uint)fVar26);
        pfVar4 = pfVar13 + uVar31;
        fVar56 = pfVar4[1];
        fVar57 = pfVar4[2];
        fVar58 = pfVar4[3];
        pfVar5 = pfVar13 + uVar31;
        *pfVar5 = (float)(~uVar44 & (uint)*pfVar4 |
                         ((uint)(fVar48 - fVar52) & uVar32 | (uint)(fVar52 - fVar48) & uVar28) &
                         uVar44);
        pfVar5[1] = (float)(~uVar45 & (uint)fVar56 |
                           ((uint)(fVar49 - fVar53) & uVar33 | (uint)(fVar53 - fVar49) & uVar21) &
                           uVar45);
        pfVar5[2] = (float)(~uVar46 & (uint)fVar57 |
                           ((uint)(fVar50 - fVar54) & uVar34 | (uint)(fVar54 - fVar50) & uVar22) &
                           uVar46);
        pfVar5[3] = (float)(~uVar47 & (uint)fVar58 |
                           ((uint)(fVar51 - fVar55) & uVar35 | (uint)(fVar55 - fVar51) & uVar23) &
                           uVar47);
      }
      if (pfVar14 != (float *)0x0) {
        pfVar4 = pfVar14 + uVar31;
        fVar48 = pfVar4[1];
        fVar49 = pfVar4[2];
        fVar50 = pfVar4[3];
        pfVar5 = pfVar14 + uVar31;
        *pfVar5 = (float)(~uVar44 & (uint)*pfVar4);
        pfVar5[1] = (float)(~uVar45 & (uint)fVar48);
        pfVar5[2] = (float)(~uVar46 & (uint)fVar49);
        pfVar5[3] = (float)(~uVar47 & (uint)fVar50);
        pfVar4 = pfVar15 + uVar31;
        fVar48 = pfVar4[1];
        fVar49 = pfVar4[2];
        fVar50 = pfVar4[3];
        pfVar5 = pfVar15 + uVar31;
        *pfVar5 = (float)(~uVar44 & (uint)*pfVar4);
        pfVar5[1] = (float)(~uVar45 & (uint)fVar48);
        pfVar5[2] = (float)(~uVar46 & (uint)fVar49);
        pfVar5[3] = (float)(~uVar47 & (uint)fVar50);
        pfVar4 = pfVar16 + uVar31;
        fVar48 = pfVar4[1];
        fVar49 = pfVar4[2];
        fVar50 = pfVar4[3];
        pfVar5 = pfVar16 + uVar31;
        *pfVar5 = (float)(~uVar44 & (uint)*pfVar4);
        pfVar5[1] = (float)(~uVar45 & (uint)fVar48);
        pfVar5[2] = (float)(~uVar46 & (uint)fVar49);
        pfVar5[3] = (float)(~uVar47 & (uint)fVar50);
      }
      uVar31 = uVar31 + 4;
    } while (uVar31 < uVar9);
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      float v = args->v;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* dPdv = args->dPdv;
      float* ddPdudu = args->ddPdudu;
      float* ddPdvdv = args->ddPdvdv;
      float* ddPdudv = args->ddPdudv;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }
      
      for (unsigned int i=0; i<valueCount; i+=N)
      {
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>(int(valueCount));
        const size_t ofs = i*sizeof(float);
        const Quad& tri = quad(primID);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[0]*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[1]*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[2]*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[3]*stride+ofs]);      
        const vbool<N> left = u+v <= 1.0f;
        const vfloat<N> Q0 = select(left,p0,p2);
        const vfloat<N> Q1 = select(left,p1,p3);
        const vfloat<N> Q2 = select(left,p3,p1);
        const vfloat<N> U  = select(left,u,vfloat<N>(1.0f)-u);
        const vfloat<N> V  = select(left,v,vfloat<N>(1.0f)-v);
        const vfloat<N> W  = 1.0f-U-V;
        if (P) {
          mem<vfloat<N>>::storeu(valid,P+i,madd(W,Q0,madd(U,Q1,V*Q2)));
        }
        if (dPdu) { 
          assert(dPdu); mem<vfloat<N>>::storeu(valid,dPdu+i,select(left,Q1-Q0,Q0-Q1));
          assert(dPdv); mem<vfloat<N>>::storeu(valid,dPdv+i,select(left,Q2-Q0,Q0-Q2));
        }
        if (ddPdudu) { 
          assert(ddPdudu); mem<vfloat<N>>::storeu(valid,ddPdudu+i,vfloat<N>(zero));
          assert(ddPdvdv); mem<vfloat<N>>::storeu(valid,ddPdvdv+i,vfloat<N>(zero));
          assert(ddPdudv); mem<vfloat<N>>::storeu(valid,ddPdudv+i,vfloat<N>(zero));
        }
      }
    }